

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void lys_submodule_free(lys_submodule *submodule,
                       _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  if (submodule != (lys_submodule *)0x0) {
    module_free_common((lys_module *)submodule,private_destructor);
    free(submodule);
    return;
  }
  return;
}

Assistant:

void
lys_submodule_free(struct lys_submodule *submodule, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    if (!submodule) {
        return;
    }

    /* common part with struct ly_module */
    module_free_common((struct lys_module *)submodule, private_destructor);

    /* no specific items to free */

    free(submodule);
}